

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

int __thiscall deqp::gles31::Functional::numBasicSubobjects(Functional *this,VarType *type)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  Functional *this_00;
  ulong uVar7;
  bool bVar8;
  
  iVar6 = 1;
  for (; iVar4 = *(int *)this, iVar4 == 1; this = *(Functional **)(this + 8)) {
    iVar6 = iVar6 * *(int *)(this + 0x10);
  }
  if (iVar4 == 0) {
    iVar4 = 1;
  }
  else if (iVar4 == 2) {
    lVar1 = *(long *)(*(long *)(this + 8) + 0x20);
    uVar3 = (*(long *)(*(long *)(this + 8) + 0x28) - lVar1) / 0x38;
    uVar5 = 0;
    uVar7 = uVar3 & 0xffffffff;
    if ((int)uVar3 < 1) {
      uVar7 = uVar5;
    }
    this_00 = (Functional *)(lVar1 + 0x20);
    while( true ) {
      iVar4 = (int)uVar5;
      bVar8 = uVar7 == 0;
      uVar7 = uVar7 - 1;
      if (bVar8) break;
      iVar2 = numBasicSubobjects(this_00,type);
      uVar5 = (ulong)(uint)(iVar4 + iVar2);
      this_00 = this_00 + 0x38;
    }
  }
  else {
    iVar4 = -1;
  }
  return iVar4 * iVar6;
}

Assistant:

static int numBasicSubobjects (const glu::VarType& type)
{
	if (type.isBasicType())
		return 1;
	else if (type.isArrayType())
		return type.getArraySize()*numBasicSubobjects(type.getElementType());
	else if (type.isStructType())
	{
		const glu::StructType&	structType	= *type.getStructPtr();
		int						result		= 0;
		for (int i = 0; i < structType.getNumMembers(); i++)
			result += numBasicSubobjects(structType.getMember(i).getType());
		return result;
	}
	else
	{
		DE_ASSERT(false);
		return -1;
	}
}